

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank.cc
# Opt level: O2

Entry * __thiscall rank::Rank::find(Rank *this,Key key)

{
  Entry *pEVar1;
  ulong uVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  difference_type __d;
  ulong uVar5;
  
  pEVar4 = (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = ((long)pEVar1 - (long)pEVar4) / 0x18;
  while (uVar2 = uVar5, 0 < (long)uVar2) {
    uVar5 = uVar2 >> 1;
    if (pEVar4[uVar5]._key_value._key < key) {
      pEVar4 = pEVar4 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar2;
    }
  }
  pEVar3 = (Entry *)0x0;
  if ((pEVar4 != pEVar1) && ((pEVar4->_key_value)._key == key)) {
    pEVar3 = pEVar4;
  }
  return pEVar3;
}

Assistant:

const Entry* Rank::find(Key key) const {
        auto it = std::lower_bound(_entries.begin(), _entries.end(), key, [](const Entry& r, Key key) { return r.key() < key; });
        return (it == _entries.end() || it->key() != key) ? nullptr : &(*it);
    }